

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::GenerateTargetInstallRules
          (cmLocalGenerator *this,ostream *os,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurationTypes)

{
  pointer ppcVar1;
  cmGeneratorTarget *this_00;
  _Alloc_hider _Var2;
  TargetType TVar3;
  char *pcVar4;
  string *psVar5;
  pointer ppcVar6;
  string destination;
  cmInstallScriptGenerator g;
  
  ppcVar6 = (this->GeneratorTargets).
            super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppcVar1 = (this->GeneratorTargets).
            super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppcVar6 == ppcVar1) {
      return;
    }
    this_00 = *ppcVar6;
    TVar3 = cmGeneratorTarget::GetType(this_00);
    if (TVar3 != INTERFACE_LIBRARY) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&g,"PRE_INSTALL_SCRIPT",(allocator<char> *)&destination);
      pcVar4 = cmGeneratorTarget::GetProperty(this_00,(string *)&g);
      std::__cxx11::string::~string((string *)&g);
      if (pcVar4 != (char *)0x0) {
        cmInstallScriptGenerator::cmInstallScriptGenerator(&g,pcVar4,false,(char *)0x0,false);
        cmScriptGenerator::Generate((cmScriptGenerator *)&g,os,config,configurationTypes);
        cmInstallScriptGenerator::~cmInstallScriptGenerator(&g);
      }
      std::__cxx11::string::string((string *)&g,(string *)&this_00->Target->InstallPath);
      _Var2 = g.super_cmInstallGenerator.super_cmScriptGenerator.RuntimeConfigVariable._M_dataplus;
      std::__cxx11::string::~string((string *)&g);
      if (_Var2._M_p != (pointer)0x0) {
        std::__cxx11::string::string((string *)&g,(string *)&this_00->Target->InstallPath);
        std::__cxx11::string::substr((ulong)&destination,(ulong)&g);
        std::__cxx11::string::~string((string *)&g);
        cmsys::SystemTools::ConvertToUnixSlashes(&destination);
        if (destination._M_string_length == 0) {
          std::__cxx11::string::assign((char *)&destination);
        }
        TVar3 = cmGeneratorTarget::GetType(this_00);
        if (TVar3 < SHARED_LIBRARY) {
LAB_00294204:
          psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
          cmInstallTargetGeneratorLocal::cmInstallTargetGeneratorLocal
                    ((cmInstallTargetGeneratorLocal *)&g,this,psVar5,destination._M_dataplus._M_p,
                     false);
          cmScriptGenerator::Generate((cmScriptGenerator *)&g,os,config,configurationTypes);
LAB_00294272:
          cmInstallTargetGenerator::~cmInstallTargetGenerator((cmInstallTargetGenerator *)&g);
        }
        else {
          if (TVar3 == SHARED_LIBRARY) {
            psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
            cmInstallTargetGeneratorLocal::cmInstallTargetGeneratorLocal
                      ((cmInstallTargetGeneratorLocal *)&g,this,psVar5,destination._M_dataplus._M_p,
                       false);
            cmScriptGenerator::Generate((cmScriptGenerator *)&g,os,config,configurationTypes);
            goto LAB_00294272;
          }
          if (TVar3 == MODULE_LIBRARY) goto LAB_00294204;
        }
        std::__cxx11::string::~string((string *)&destination);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&g,"POST_INSTALL_SCRIPT",(allocator<char> *)&destination);
      pcVar4 = cmGeneratorTarget::GetProperty(this_00,(string *)&g);
      std::__cxx11::string::~string((string *)&g);
      if (pcVar4 != (char *)0x0) {
        cmInstallScriptGenerator::cmInstallScriptGenerator(&g,pcVar4,false,(char *)0x0,false);
        cmScriptGenerator::Generate((cmScriptGenerator *)&g,os,config,configurationTypes);
        cmInstallScriptGenerator::~cmInstallScriptGenerator(&g);
      }
    }
    ppcVar6 = ppcVar6 + 1;
  } while( true );
}

Assistant:

void cmLocalGenerator::GenerateTargetInstallRules(
  std::ostream& os, const std::string& config,
  std::vector<std::string> const& configurationTypes)
{
  // Convert the old-style install specification from each target to
  // an install generator and run it.
  const std::vector<cmGeneratorTarget*>& tgts = this->GetGeneratorTargets();
  for (cmGeneratorTarget* l : tgts) {
    if (l->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }

    // Include the user-specified pre-install script for this target.
    if (const char* preinstall = l->GetProperty("PRE_INSTALL_SCRIPT")) {
      cmInstallScriptGenerator g(preinstall, false, nullptr, false);
      g.Generate(os, config, configurationTypes);
    }

    // Install this target if a destination is given.
    if (!l->Target->GetInstallPath().empty()) {
      // Compute the full install destination.  Note that converting
      // to unix slashes also removes any trailing slash.
      // We also skip over the leading slash given by the user.
      std::string destination = l->Target->GetInstallPath().substr(1);
      cmSystemTools::ConvertToUnixSlashes(destination);
      if (destination.empty()) {
        destination = ".";
      }

      // Generate the proper install generator for this target type.
      switch (l->GetType()) {
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY: {
          // Use a target install generator.
          cmInstallTargetGeneratorLocal g(this, l->GetName(),
                                          destination.c_str(), false);
          g.Generate(os, config, configurationTypes);
        } break;
        case cmStateEnums::SHARED_LIBRARY: {
#if defined(_WIN32) || defined(__CYGWIN__)
          // Special code to handle DLL.  Install the import library
          // to the normal destination and the DLL to the runtime
          // destination.
          cmInstallTargetGeneratorLocal g1(this, l->GetName(),
                                           destination.c_str(), true);
          g1.Generate(os, config, configurationTypes);
          // We also skip over the leading slash given by the user.
          destination = l->Target->GetRuntimeInstallPath().substr(1);
          cmSystemTools::ConvertToUnixSlashes(destination);
          cmInstallTargetGeneratorLocal g2(this, l->GetName(),
                                           destination.c_str(), false);
          g2.Generate(os, config, configurationTypes);
#else
          // Use a target install generator.
          cmInstallTargetGeneratorLocal g(this, l->GetName(),
                                          destination.c_str(), false);
          g.Generate(os, config, configurationTypes);
#endif
        } break;
        default:
          break;
      }
    }

    // Include the user-specified post-install script for this target.
    if (const char* postinstall = l->GetProperty("POST_INSTALL_SCRIPT")) {
      cmInstallScriptGenerator g(postinstall, false, nullptr, false);
      g.Generate(os, config, configurationTypes);
    }
  }
}